

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

size_t helics::detail::convertToBinary(byte *data,vector<double,_std::allocator<double>_> *val)

{
  bool bVar1;
  void *__dest;
  double *__src;
  size_type sVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  byte code;
  byte *in_stack_ffffffffffffffe0;
  
  code = (byte)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  CLI::std::vector<double,_std::allocator<double>_>::size(in_RSI);
  addCodeAndSize(in_stack_ffffffffffffffe0,code,0x381384);
  bVar1 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_RSI);
  if (!bVar1) {
    __dest = (void *)(in_RDI + 8);
    __src = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x3813a9);
    sVar2 = CLI::std::vector<double,_std::allocator<double>_>::size(in_RSI);
    memcpy(__dest,__src,sVar2 << 3);
  }
  sVar2 = CLI::std::vector<double,_std::allocator<double>_>::size(in_RSI);
  return sVar2 * 8 + 8;
}

Assistant:

size_t convertToBinary(std::byte* data, const std::vector<double>& val)
{
    addCodeAndSize(data, vectorCode, val.size());
    if (!val.empty()) {
        std::memcpy(data + 8, val.data(), val.size() * sizeof(double));
    }
    return val.size() * sizeof(double) + 8U;
}